

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsteps.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  if (argc < 3) {
    puts(
        "Generate steps:\n\n a2->      +-------+\n           |       |\n a1-> -----+       |\n a3->              +----\n      <-n1-><--n2-><-n3>\n\ngiven in command lines as: a1 n1 a2 n2 a3 n3"
        );
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    for (lVar3 = 1; lVar3 + 1U < (ulong)(uint)argc; lVar3 = lVar3 + 2) {
      __s = argv[lVar3];
      iVar1 = atoi(argv[lVar3 + 1]);
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
        puts(__s);
      }
    }
  }
  return iVar2;
}

Assistant:

int main (int argc, char* argv[])
{
    if(argc < 3) {
	printf("Generate steps:\n"\
	       "\n"\
	       " a2->      +-------+\n"\
	       "           |       |\n"\
	       " a1-> -----+       |\n"\
	       " a3->              +----\n"\
	       "      <-n1-><--n2-><-n3>\n"\
	       "\n"\
	       "given in command lines as: a1 n1 a2 n2 a3 n3\n");
	return 1;
    }
    for(int i = 1; i+1 < argc; i += 2) {
	char	*a = argv[i];
	int	n = atoi(argv[i+1]);
	for(int j = 0; j < n; ++j) {
	    printf("%s\n", a);
	}
    }
    return 0;
}